

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O0

int ifstream_readTextFile(ifstream_t *self,char *filename)

{
  FILE *__stream;
  int *piVar1;
  FILE *fh;
  int retval;
  char *filename_local;
  ifstream_t *self_local;
  
  fh._4_4_ = 0;
  if ((self == (ifstream_t *)0x0) || (filename == (char *)0x0)) {
    fh._4_4_ = -1;
    piVar1 = __errno_location();
    *piVar1 = 0x16;
  }
  else {
    __stream = fopen(filename,"r");
    if (__stream != (FILE *)0x0) {
      fh._4_4_ = ifstream_readTextFileFromHandle(self,(FILE *)__stream);
      fclose(__stream);
    }
  }
  return fh._4_4_;
}

Assistant:

int ifstream_readTextFile(ifstream_t *self,const char *filename)
{
   int retval = 0;
   if( (self != 0) && (filename != 0) )
   {
      FILE* fh = fopen(filename,"r");
      if (fh != 0)
      {
         retval =  ifstream_readTextFileFromHandle(self, fh);
         fclose(fh);
      }
   }
   else
   {
      retval = -1;
      errno = EINVAL;
   }
   return retval;
}